

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.c
# Opt level: O0

ssize_t value_size(value_t *value)

{
  value_t *value_local;
  
  switch(value->type) {
  case 0x43:
    value_local = (value_t *)0x4;
    break;
  default:
    fprintf(_stderr,"%s:value_size: invalid type \'%c\'\n",argv0,(ulong)(uint)value->type);
    value_local = (value_t *)0xffffffffffffffff;
    break;
  case 0x53:
    value_local = (value_t *)0x4;
    break;
  case 0x55:
    value_local = (value_t *)0x4;
    break;
  case 0x62:
    value_local = (value_t *)0x1;
    break;
  case 99:
    value_local = (value_t *)0x1;
    break;
  case 100:
    value_local = (value_t *)0x8;
    break;
  case 0x66:
    value_local = (value_t *)0x4;
    break;
  case 0x6d:
    value_local = (value_t *)(value->val).z;
    break;
  case 0x73:
    value_local = (value_t *)0x2;
    break;
  case 0x75:
    value_local = (value_t *)0x2;
    break;
  case 0x7a:
    value_local = (value_t *)strlen((value->val).z);
  }
  return (ssize_t)value_local;
}

Assistant:

ssize_t
value_size(
    const value_t* value)
{
    switch (value->type) {
    case 'f':
        return sizeof(float);
    case 'd':
        return sizeof(double);
    case 'b':
        return sizeof(unsigned char);
    case 'c':
        return sizeof(char);
    case 'u':
        return sizeof(uint16_t);
    case 's':
        return sizeof(int16_t);
    case 'U':
        return sizeof(uint32_t);
    case 'S':
        return sizeof(int32_t);
    case 'C':
        return sizeof(uint32_t);
    case 'z':
        return strlen(value->val.z);
    case 'm':
        return value->val.m.length;
    default:
        fprintf(stderr, "%s:value_size: invalid type '%c'\n", argv0, value->type);
        return -1;
    }
}